

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O2

void __thiscall cmDebugServerJson::SendStatus(cmDebugServerJson *this,cmConnection *connection)

{
  string status;
  string local_30;
  
  StatusString_abi_cxx11_(&local_30,this);
  if (local_30._M_string_length != 0) {
    (**connection->_vptr_cmConnection)(connection,&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmDebugServerJson::SendStatus(cmConnection* connection)
{
  auto status = StatusString();
  if (status.size()) {
    connection->WriteData(status);
  }
}